

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_13::NameResolver::NameResolver(NameResolver *this,Script *script,Errors *errors)

{
  (this->super_DelegateNop).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR__NameResolver_013e33a8;
  this->errors_ = errors;
  this->script_ = script;
  this->current_module_ = (Module *)0x0;
  this->current_func_ = (Func *)0x0;
  ExprVisitor::ExprVisitor(&this->visitor_,(Delegate *)this);
  *(undefined8 *)
   ((long)&(this->labels_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->labels_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->labels_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->labels_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

NameResolver::NameResolver(Script* script, Errors* errors)
    : errors_(errors),
      script_(script),
      visitor_(this) {}